

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O2

int Am_Center_X_Is_Center_Of_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object center_x_obj;
  
  pAVar5 = Am_Object::Get(self,0x66,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  center_x_obj.data = (Am_Object_Data *)0x0;
  pAVar5 = Am_Object::Get(self,0xb3,0);
  Am_Object::operator=(&center_x_obj,pAVar5);
  bVar1 = Am_Object::Valid(&center_x_obj);
  iVar3 = 0;
  if (bVar1) {
    pAVar5 = Am_Object::Get(&center_x_obj,100,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(&center_x_obj,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    iVar3 = (iVar4 - iVar2) / 2 + iVar3;
  }
  Am_Object::~Am_Object(&center_x_obj);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, Am_Center_X_Is_Center_Of)
{
  int my_width = self.Get(Am_WIDTH);
  Am_Object center_x_obj;
  center_x_obj = self.Get(Am_CENTER_X_OBJ);
  if (center_x_obj.Valid()) {
    int center_x_obj_left = center_x_obj.Get(Am_LEFT);
    int center_x_obj_width = center_x_obj.Get(Am_WIDTH);
    return center_x_obj_left + ((center_x_obj_width - my_width) / 2);
  } else {
    return 0;
  }
}